

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = this->buffer_end_;
  pcVar3 = this->cursor_;
  do {
    pcVar2 = pcVar3;
    if (pcVar1 <= pcVar2) goto LAB_0012279f;
    pcVar3 = pcVar2 + 1;
    this->cursor_ = pcVar3;
    if (*pcVar2 == '\n') goto LAB_00122798;
  } while (*pcVar2 != '\r');
  if ((pcVar3 < pcVar1) && (*pcVar3 == '\n')) {
    pcVar3 = pcVar2 + 2;
    this->cursor_ = pcVar3;
  }
LAB_00122798:
  this->line_ = this->line_ + 1;
  this->line_start_ = pcVar3;
LAB_0012279f:
  return pcVar2 < pcVar1;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\r':
        if (PeekChar() == '\n') {
          ReadChar();
        }
        Newline();
        return true;

      case '\n':
        Newline();
        return true;
    }
  }
}